

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 uVar1;
  bool bVar2;
  stack_entry *psVar3;
  char *in_R9;
  value_view v;
  value_view v_00;
  key_view kVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  iterator b;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_6b0;
  AssertHelper local_6a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6a0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  undefined1 local_690 [56];
  _Elt_pointer local_658;
  _Elt_pointer local_638;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,1,v_00,false);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator((iterator *)(local_690 + 0x20),&local_500.test_db);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::last((iterator *)(local_690 + 0x20));
  local_698._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_6a0._M_head_impl._0_1_ = (internal)(local_638 != local_658);
  if (local_638 == local_658) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x71,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)local_690);
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_698);
  kVar4 = unodb::
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)(local_690 + 0x20));
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_6a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_6b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_690,"(decode(b.get_key()))","(1)",(unsigned_long *)&local_6a0,
             (int *)&local_6b0);
  if (local_690[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_6a0);
    if ((_Map_pointer)local_690._8_8_ == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1e971f;
    }
    else {
      psVar3 = *(stack_entry **)local_690._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x73,(char *)psVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_690 + 8));
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_690);
  bVar2 = std::ranges::__equal_fn::
          operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,(iterator *)local_690,0x224168);
  local_6a0._M_head_impl._0_1_ = (internal)bVar2;
  local_698._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  unodb::qsbr_ptr<const_std::byte>::~qsbr_ptr((qsbr_ptr<const_std::byte> *)local_690);
  if (local_6a0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[1])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x75,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)local_690);
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_698);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior((iterator *)(local_690 + 0x20));
  local_698._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_6a0._M_head_impl._0_1_ = (internal)(local_638 != local_658);
  if (local_638 == local_658) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x78,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)local_690);
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_698);
  kVar4 = unodb::
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          ::iterator::get_key((iterator *)(local_690 + 0x20));
  uVar1 = *(undefined8 *)kVar4._M_ptr;
  local_6a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
        (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
        (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
       uVar1 << 0x38);
  local_6b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_690,"(decode(b.get_key()))","(0)",(unsigned_long *)&local_6a0,
             (int *)&local_6b0);
  if (local_690[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_6a0);
    if ((_Map_pointer)local_690._8_8_ == (_Map_pointer)0x0) {
      psVar3 = (stack_entry *)0x1e971f;
    }
    else {
      psVar3 = *(stack_entry **)local_690._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7a,(char *)psVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_690 + 8));
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_690);
  bVar2 = std::ranges::__equal_fn::
          operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,(iterator *)local_690,
                     unodb::test::test_values);
  local_6a0._M_head_impl._0_1_ = (internal)bVar2;
  local_698._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  unodb::qsbr_ptr<const_std::byte>::~qsbr_ptr((qsbr_ptr<const_std::byte> *)local_690);
  if (local_6a0._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7c,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)local_690);
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_698);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::prior((iterator *)(local_690 + 0x20));
  local_698._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_6a0._M_head_impl._0_1_ = (internal)(local_638 == local_658);
  if (local_638 != local_658) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_690,(internal *)&local_6a0,(AssertionResult *)"b.valid()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x7f,(char *)CONCAT71(local_690._1_7_,local_690[0]));
    testing::internal::AssertHelper::operator=(&local_6a8,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)local_690);
    if ((long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_6b0.data_._4_4_,local_6b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_698);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator((iterator *)(local_690 + 0x20));
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesReverseScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.last();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.prior();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.prior();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}